

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Abc_TtCofsOppositeWithMask(word *pTruth,word *pMask,int nWords,int iVar)

{
  int iVar1;
  word *pLimit;
  word *m;
  word *p;
  int Step;
  int w_1;
  int Shift;
  int w;
  int iVar_local;
  int nWords_local;
  word *pMask_local;
  word *pTruth_local;
  
  if (iVar < 6) {
    for (w_1 = 0; w_1 < nWords; w_1 = w_1 + 1) {
      if ((pTruth[w_1] << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f) & s_Truths6[iVar] & pMask[w_1])
          != ((pTruth[w_1] ^ 0xffffffffffffffff) & s_Truths6[iVar] & pMask[w_1])) {
        return 0;
      }
    }
  }
  else {
    iVar1 = 1 << ((byte)iVar - 6 & 0x1f);
    pLimit = pMask;
    for (m = pTruth; m < pTruth + nWords; m = m + (iVar1 << 1)) {
      for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
        if ((m[p._4_4_] & pLimit[p._4_4_]) !=
            ((m[p._4_4_ + iVar1] ^ 0xffffffffffffffff) & pLimit[p._4_4_ + iVar1])) {
          return 0;
        }
      }
      pLimit = pLimit + (iVar1 << 1);
    }
  }
  return 1;
}

Assistant:

static int Abc_TtCofsOppositeWithMask( word * pTruth, word * pMask, int nWords, int iVar )
{
    if ( iVar < 6 )
    {
        int w, Shift = ( 1 << iVar );
        for ( w = 0; w < nWords; ++w )
            if ( ( ( pTruth[w] << Shift ) & s_Truths6[iVar] & pMask[w] ) != ( ~pTruth[w] & s_Truths6[iVar] & pMask[w] ) )
                return 0;
        return 1;
    }
    else
    {
        int w, Step = ( 1 << ( iVar - 6 ) );
        word * p = pTruth, * m = pMask, * pLimit = pTruth + nWords;
        for ( ; p < pLimit; p += 2 * Step, m += 2 * Step )
            for ( w = 0; w < Step; ++w )
                if ( ( p[w] & m[w] ) != ( ~p[w + Step] & m[w + Step] ) )
                    return 0;
        return 1;
    }
}